

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  bool *pbVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  undefined4 *puVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  undefined4 *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  byte bVar17;
  long in_FS_OFFSET;
  byte bVar18;
  Real a;
  ulong uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [13];
  undefined3 uStack_37b;
  int iStack_378;
  bool bStack_374;
  ulong local_370;
  undefined1 local_368 [32];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [13];
  undefined3 uStack_2fb;
  int iStack_2f8;
  bool bStack_2f4;
  undefined8 local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [13];
  undefined3 uStack_27b;
  int iStack_278;
  bool abStack_274 [4];
  ulong local_270;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 local_258 [32];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [13];
  undefined3 uStack_1eb;
  int iStack_1e8;
  bool bStack_1e4;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [13];
  undefined3 uStack_16b;
  int iStack_168;
  bool abStack_164 [4];
  ulong local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [13];
  undefined3 uStack_eb;
  int iStack_e8;
  bool bStack_e4;
  undefined8 local_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  bVar18 = 0;
  local_270._0_4_ = cpp_dec_float_finite;
  local_270._4_4_ = 0x1c;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = SUB1613((undefined1  [16])0x0,0);
  uStack_27b = 0;
  iStack_278 = 0;
  abStack_274[0] = false;
  local_e0._0_4_ = cpp_dec_float_finite;
  local_e0._4_4_ = 0x1c;
  local_158._0_16_ = (undefined1  [16])0x0;
  local_158._16_16_ = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = SUB1613((undefined1  [16])0x0,0);
  uStack_eb = 0;
  iStack_e8 = 0;
  bStack_e4 = false;
  local_160 = 0x1c00000000;
  local_1d8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = SUB1613((undefined1  [16])0x0,0);
  uStack_16b = 0;
  iStack_168 = 0;
  abStack_164[0] = false;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x1c;
  local_b8._0_16_ = (undefined1  [16])0x0;
  local_b8._16_16_ = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  iStack_48 = 0;
  bStack_44 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_b8,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pnVar9 = val;
  puVar13 = (uint *)local_158;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar13 = (pnVar9->m_backend).data._M_elems[0];
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar18 * -2 + 1) * 4);
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
  }
  iStack_e8 = (val->m_backend).exp;
  bStack_e4 = (val->m_backend).neg;
  local_e0._0_4_ = (val->m_backend).fpclass;
  local_e0._4_4_ = (val->m_backend).prec_elem;
  local_260 = val;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)local_1d8,0);
  if (num != 0) {
    pnVar9 = &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).delta;
    local_d8 = *(double *)(in_FS_OFFSET + -8);
    uStack_d0 = 0;
    local_c8 = -*(double *)(in_FS_OFFSET + -8);
    uStack_c0 = 0x8000000000000000;
    lVar5 = (long)num;
    do {
      iVar3 = idx[lVar5 + -1];
      pnVar10 = upd + iVar3;
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
      }
      iStack_278 = upd[iVar3].m_backend.exp;
      abStack_274[0] = upd[iVar3].m_backend.neg;
      local_270._0_4_ = upd[iVar3].m_backend.fpclass;
      local_270._4_4_ = upd[iVar3].m_backend.prec_elem;
      if ((((fpclass_type)local_270 == 2) || ((fpclass_type)local_40 == cpp_dec_float_NaN)) ||
         (iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                             (cpp_dec_float<200U,_int,_void> *)local_b8), iVar2 < 1)) {
        puVar13 = (uint *)local_b8;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_3e8;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar11->data)._M_elems[0] = *puVar13;
          puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
        }
        iStack_378 = iStack_48;
        bStack_374 = bStack_44;
        local_370._0_4_ = (fpclass_type)local_40;
        local_370._4_4_ = local_40._4_4_;
        if (local_3e8._0_4_ != 0 || (fpclass_type)local_40 != cpp_dec_float_finite) {
          bStack_374 = (bool)(bStack_44 ^ 1);
        }
        if ((((fpclass_type)local_40 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_270 != cpp_dec_float_NaN)) &&
           (iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                               (cpp_dec_float<200U,_int,_void> *)local_3e8), iVar2 < 0)) {
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_3e8;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
          }
          iStack_378 = iStack_278;
          bStack_374 = abStack_274[0];
          local_370 = local_270;
          if (local_3e8._0_4_ != 0 || (int)local_270 != 0) {
            bStack_374 = (bool)(abStack_274[0] ^ 1);
          }
          if ((((int)local_270 == 2) || ((fpclass_type)local_160 == cpp_dec_float_NaN)) ||
             (iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_3e8,
                                 (cpp_dec_float<200U,_int,_void> *)local_1d8), iVar2 < 1)) {
            uVar4 = local_1d8._0_4_;
            puVar12 = (undefined4 *)(local_1d8 + 4);
            puVar15 = (undefined4 *)local_258;
            for (lVar6 = 0x1b; bVar17 = abStack_164[0], iVar2 = iStack_168, uVar19 = local_160,
                lVar6 != 0; lVar6 = lVar6 + -1) {
              *puVar15 = *puVar12;
              puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
              puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
            }
          }
          else {
            puVar12 = (undefined4 *)(local_2e8 + 4);
            puVar15 = (undefined4 *)local_258;
            for (lVar6 = 0x1b; lVar6 != 0; lVar6 = lVar6 + -1) {
              *puVar15 = *puVar12;
              puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
              puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
            }
            bVar17 = ((int)local_270 != 0 || local_2e8._0_4_ != 0) ^ abStack_274[0];
            uVar4 = local_2e8._0_4_;
            iVar2 = iStack_278;
            uVar19 = local_270;
          }
          local_1d8._0_4_ = uVar4;
          puVar12 = (undefined4 *)local_258;
          puVar15 = (undefined4 *)(local_1d8 + 4);
          for (lVar6 = 0x1b; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar15 = *puVar12;
            puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
          }
          pcVar11 = &up[iVar3].m_backend;
          local_2f0._0_4_ = cpp_dec_float_finite;
          local_2f0._4_4_ = 0x1c;
          local_368._0_16_ = (undefined1  [16])0x0;
          local_368._16_16_ = (undefined1  [16])0x0;
          local_348 = (undefined1  [16])0x0;
          local_338 = (undefined1  [16])0x0;
          local_328 = (undefined1  [16])0x0;
          local_318 = (undefined1  [16])0x0;
          local_308 = SUB1613((undefined1  [16])0x0,0);
          uStack_2fb = 0;
          iStack_2f8 = 0;
          bStack_2f4 = false;
          iStack_168 = iVar2;
          abStack_164[0] = (bool)bVar17;
          local_160 = uVar19;
          if ((cpp_dec_float<200U,_int,_void> *)local_368 == &vec[iVar3].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_368,pcVar11);
            if (local_368._0_4_ != 0 || (fpclass_type)local_2f0 != cpp_dec_float_finite) {
              bStack_2f4 = (bool)(bStack_2f4 ^ 1);
            }
          }
          else {
            if ((cpp_dec_float<200U,_int,_void> *)local_368 != pcVar11) {
              pcVar14 = pcVar11;
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_368;
              for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                (pcVar16->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4)
                ;
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar18 * -8 + 4)
                ;
              }
              iStack_2f8 = pcVar11->exp;
              bStack_2f4 = pcVar11->neg;
              local_2f0._0_4_ = pcVar11->fpclass;
              local_2f0._4_4_ = pcVar11->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_368,&vec[iVar3].m_backend);
          }
          local_1e0._0_4_ = cpp_dec_float_finite;
          local_1e0._4_4_ = 0x1c;
          local_258._0_16_ = (undefined1  [16])0x0;
          local_258._16_16_ = (undefined1  [16])0x0;
          local_238 = (undefined1  [16])0x0;
          local_228 = (undefined1  [16])0x0;
          local_218 = (undefined1  [16])0x0;
          local_208 = (undefined1  [16])0x0;
          local_1f8 = SUB1613((undefined1  [16])0x0,0);
          uStack_1eb = 0;
          iStack_1e8 = 0;
          bStack_1e4 = false;
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_368;
          if ((cpp_dec_float<200U,_int,_void> *)local_258 != &pnVar9->m_backend) {
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_258;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar18 * -8 + 4);
            }
            iStack_1e8 = iStack_2f8;
            bStack_1e4 = bStack_2f4;
            local_1e0._0_4_ = (fpclass_type)local_2f0;
            local_1e0._4_4_ = local_2f0._4_4_;
            pcVar14 = &pnVar9->m_backend;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_258,pcVar14);
          local_370._0_4_ = cpp_dec_float_finite;
          local_370._4_4_ = 0x1c;
          local_3e8 = (undefined1  [16])0x0;
          local_3d8 = (undefined1  [16])0x0;
          local_3c8 = (undefined1  [16])0x0;
          local_3b8 = (undefined1  [16])0x0;
          local_3a8 = (undefined1  [16])0x0;
          local_398 = (undefined1  [16])0x0;
          local_388 = SUB1613((undefined1  [16])0x0,0);
          uStack_37b = 0;
          iStack_378 = 0;
          bStack_374 = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_3e8,
                     (cpp_dec_float<200U,_int,_void> *)local_258,
                     (cpp_dec_float<200U,_int,_void> *)local_2e8);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_3e8;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar16->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar18 * -8 + 4);
          }
          iStack_278 = iStack_378;
          abStack_274[0] = bStack_374;
          local_270 = local_370;
          if ((((fpclass_type)local_370 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_e0 != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                 (cpp_dec_float<200U,_int,_void> *)local_158), 0 < iVar3)) {
            ::soplex::infinity::__tls_init();
            local_370._0_4_ = cpp_dec_float_finite;
            local_370._4_4_ = 0x1c;
            local_3e8 = (undefined1  [16])0x0;
            local_3d8 = (undefined1  [16])0x0;
            local_3c8 = (undefined1  [16])0x0;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = (undefined1  [16])0x0;
            local_398 = (undefined1  [16])0x0;
            local_388 = SUB1613((undefined1  [16])0x0,0);
            uStack_37b = 0;
            iStack_378 = 0;
            bStack_374 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_3e8,local_d8);
            if (((pcVar11->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_370 != cpp_dec_float_NaN)) &&
               (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (pcVar11,(cpp_dec_float<200U,_int,_void> *)local_3e8), iVar3 < 0))
            goto LAB_005c3b89;
          }
        }
      }
      else {
        bVar1 = false;
        if (((fpclass_type)local_270 != cpp_dec_float_NaN) &&
           ((fpclass_type)local_160 != cpp_dec_float_NaN)) {
          iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                             (cpp_dec_float<200U,_int,_void> *)local_1d8);
          bVar1 = 0 < iVar2;
        }
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
        if (bVar1) {
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
        }
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        piVar7 = &iStack_168;
        if (bVar1) {
          piVar7 = &iStack_278;
        }
        iStack_168 = *piVar7;
        pbVar8 = abStack_164;
        if (bVar1) {
          pbVar8 = abStack_274;
        }
        abStack_164[0] = *pbVar8;
        uVar19 = CONCAT44((int)((uint)bVar1 << 0x1f) >> 0x1f,(int)((uint)bVar1 << 0x1f) >> 0x1f);
        local_160 = ~uVar19 & local_160 | local_270 & uVar19;
        pcVar11 = &low[iVar3].m_backend;
        local_2f0._0_4_ = cpp_dec_float_finite;
        local_2f0._4_4_ = 0x1c;
        local_368._0_16_ = (undefined1  [16])0x0;
        local_368._16_16_ = (undefined1  [16])0x0;
        local_348 = (undefined1  [16])0x0;
        local_338 = (undefined1  [16])0x0;
        local_328 = (undefined1  [16])0x0;
        local_318 = (undefined1  [16])0x0;
        local_308 = SUB1613((undefined1  [16])0x0,0);
        uStack_2fb = 0;
        iStack_2f8 = 0;
        bStack_2f4 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_368 == &vec[iVar3].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_368,pcVar11);
          if (local_368._0_4_ != 0 || (fpclass_type)local_2f0 != cpp_dec_float_finite) {
            bStack_2f4 = (bool)(bStack_2f4 ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<200U,_int,_void> *)local_368 != pcVar11) {
            pcVar14 = pcVar11;
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_368;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar18 * -8 + 4);
            }
            iStack_2f8 = pcVar11->exp;
            bStack_2f4 = pcVar11->neg;
            local_2f0._0_4_ = pcVar11->fpclass;
            local_2f0._4_4_ = pcVar11->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_368,&vec[iVar3].m_backend);
        }
        local_1e0._0_4_ = cpp_dec_float_finite;
        local_1e0._4_4_ = 0x1c;
        local_258._0_16_ = (undefined1  [16])0x0;
        local_258._16_16_ = (undefined1  [16])0x0;
        local_238 = (undefined1  [16])0x0;
        local_228 = (undefined1  [16])0x0;
        local_218 = (undefined1  [16])0x0;
        local_208 = (undefined1  [16])0x0;
        local_1f8 = SUB1613((undefined1  [16])0x0,0);
        uStack_1eb = 0;
        iStack_1e8 = 0;
        bStack_1e4 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_258 == &pnVar9->m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_258,
                     (cpp_dec_float<200U,_int,_void> *)local_368);
          if (local_258._0_4_ != 0 || (fpclass_type)local_1e0 != cpp_dec_float_finite) {
            bStack_1e4 = (bool)(bStack_1e4 ^ 1);
          }
        }
        else {
          puVar13 = (uint *)local_368;
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_258;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar14->data)._M_elems[0] = *puVar13;
            puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
          }
          iStack_1e8 = iStack_2f8;
          bStack_1e4 = bStack_2f4;
          local_1e0._0_4_ = (fpclass_type)local_2f0;
          local_1e0._4_4_ = local_2f0._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_258,&pnVar9->m_backend);
        }
        local_370._0_4_ = cpp_dec_float_finite;
        local_370._4_4_ = 0x1c;
        local_3e8 = (undefined1  [16])0x0;
        local_3d8 = (undefined1  [16])0x0;
        local_3c8 = (undefined1  [16])0x0;
        local_3b8 = (undefined1  [16])0x0;
        local_3a8 = (undefined1  [16])0x0;
        local_398 = (undefined1  [16])0x0;
        local_388 = SUB1613((undefined1  [16])0x0,0);
        uStack_37b = 0;
        iStack_378 = 0;
        bStack_374 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_3e8,
                   (cpp_dec_float<200U,_int,_void> *)local_258,
                   (cpp_dec_float<200U,_int,_void> *)local_2e8);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_3e8;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar16->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar18 * -8 + 4);
        }
        iStack_278 = iStack_378;
        abStack_274[0] = bStack_374;
        local_270 = local_370;
        if ((((fpclass_type)local_370 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_e0 != cpp_dec_float_NaN)) &&
           (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                               (cpp_dec_float<200U,_int,_void> *)local_158), 0 < iVar3)) {
          ::soplex::infinity::__tls_init();
          local_370._0_4_ = cpp_dec_float_finite;
          local_370._4_4_ = 0x1c;
          local_3e8 = (undefined1  [16])0x0;
          local_3d8 = (undefined1  [16])0x0;
          local_3c8 = (undefined1  [16])0x0;
          local_3b8 = (undefined1  [16])0x0;
          local_3a8 = (undefined1  [16])0x0;
          local_398 = (undefined1  [16])0x0;
          local_388 = SUB1613((undefined1  [16])0x0,0);
          uStack_37b = 0;
          iStack_378 = 0;
          bStack_374 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_3e8,local_c8);
          if (((pcVar11->fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_370 != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar11,(cpp_dec_float<200U,_int,_void> *)local_3e8), 0 < iVar3)) {
LAB_005c3b89:
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
            puVar13 = (uint *)local_158;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              *puVar13 = (pcVar11->data)._M_elems[0];
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
              puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
            }
            iStack_e8 = iStack_278;
            bStack_e4 = abStack_274[0];
            local_e0._0_4_ = (fpclass_type)local_270;
            local_e0._4_4_ = local_270._4_4_;
          }
        }
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  puVar13 = (uint *)local_158;
  pnVar9 = local_260;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = *puVar13;
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  (local_260->m_backend).exp = iStack_e8;
  (local_260->m_backend).neg = bStack_e4;
  (local_260->m_backend).fpclass = (fpclass_type)local_e0;
  (local_260->m_backend).prec_elem = local_e0._4_4_;
  return -1;
}

Assistant:

int SPxHarrisRT<R>::minDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
) const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val < 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x > theval && low[i] > R(-infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x > theval && up[i] < R(infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}